

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

Socket * ssh_connection_sharing_init
                   (char *host,int port,Conf *conf,LogContext *logctx,Plug *sshplug,
                   ssh_sharing_state **state)

{
  ssh_sharing_state *psVar1;
  LogContext *ctx;
  ssh_sharing_state **ppsVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  tree234 *ptVar6;
  Socket *pSVar7;
  char *logtext;
  ssh_sharing_state *local_68;
  char *local_60;
  Socket *sock;
  LogContext *local_50;
  ssh_sharing_state **local_48;
  char *us_err;
  char *ds_err;
  
  _Var3 = conf_get_bool(conf,0xc0);
  if ((!_Var3) || (local_50 = logctx, local_48 = state, _Var3 = conf_get_bool(conf,0xc2), !_Var3)) {
    return (Socket *)0x0;
  }
  pcVar5 = ssh_share_sockname(host,port,conf);
  local_68 = (ssh_sharing_state *)safemalloc(1,0x38,0);
  (local_68->plug).vt = &ssh_sharing_listen_plugvt;
  local_68->listensock = (Socket *)0x0;
  local_68->cl = (ConnectionLayer *)0x0;
  sock = (Socket *)0x0;
  us_err = (char *)0x0;
  ds_err = (char *)0x0;
  logtext = (char *)0x0;
  local_60 = pcVar5;
  iVar4 = platform_ssh_share(pcVar5,conf,sshplug,&local_68->plug,&sock,&logtext,&ds_err,&us_err,
                             false,_Var3);
  ppsVar2 = local_48;
  ctx = local_50;
  if (iVar4 == 2) {
    pSVar7 = (Socket *)0x0;
    logeventf(local_50,"Sharing this connection at %s",logtext);
    psVar1 = local_68;
    *local_48 = local_68;
    local_68->listensock = sock;
    ptVar6 = newtree234(share_connstate_cmp);
    psVar1->connections = ptVar6;
    psVar1->server_verstring = (char *)0x0;
    psVar1->sockname = local_60;
    psVar1->nextid = 1;
    goto LAB_00138fce;
  }
  if (iVar4 == 1) {
    logeventf(local_50,"Using existing shared connection at %s",logtext);
    *ppsVar2 = (ssh_sharing_state *)0x0;
    safefree(local_68);
    safefree(local_60);
    pSVar7 = sock;
    goto LAB_00138fce;
  }
  pSVar7 = (Socket *)0x0;
  if (iVar4 != 0) goto LAB_00138fce;
  if (logtext == (char *)0x0) {
    if (ds_err != (char *)0x0) {
      logeventf(local_50,"Could not set up connection sharing as downstream: %s");
    }
    if (us_err != (char *)0x0) {
      pcVar5 = "Could not set up connection sharing as upstream: %s";
      goto LAB_00138f9e;
    }
  }
  else {
    pcVar5 = "Could not set up connection sharing: %s";
LAB_00138f9e:
    logeventf(ctx,pcVar5);
  }
  if (sock != (Socket *)0x0) {
    __assert_fail("sock == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                  0x857,
                  "Socket *ssh_connection_sharing_init(const char *, int, Conf *, LogContext *, Plug *, ssh_sharing_state **)"
                 );
  }
  *ppsVar2 = (ssh_sharing_state *)0x0;
  safefree(local_68);
  safefree(local_60);
  pSVar7 = (Socket *)0x0;
LAB_00138fce:
  safefree(logtext);
  safefree(ds_err);
  safefree(us_err);
  return pSVar7;
}

Assistant:

Socket *ssh_connection_sharing_init(
    const char *host, int port, Conf *conf, LogContext *logctx,
    Plug *sshplug, ssh_sharing_state **state)
{
    int result;
    bool can_upstream, can_downstream;
    char *logtext, *ds_err, *us_err;
    char *sockname;
    Socket *sock, *toret = NULL;
    struct ssh_sharing_state *sharestate;

    if (!conf_get_bool(conf, CONF_ssh_connection_sharing))
        return NULL;                   /* do not share anything */
    can_upstream = share_can_be_upstream &&
        conf_get_bool(conf, CONF_ssh_connection_sharing_upstream);
    can_downstream = share_can_be_downstream &&
        conf_get_bool(conf, CONF_ssh_connection_sharing_downstream);
    if (!can_upstream && !can_downstream)
        return NULL;

    sockname = ssh_share_sockname(host, port, conf);

    /*
     * Create a data structure for the listening plug if we turn out
     * to be an upstream.
     */
    sharestate = snew(struct ssh_sharing_state);
    sharestate->plug.vt = &ssh_sharing_listen_plugvt;
    sharestate->listensock = NULL;
    sharestate->cl = NULL;

    /*
     * Now hand off to a per-platform routine that either connects to
     * an existing upstream (using 'ssh' as the plug), establishes our
     * own upstream (using 'sharestate' as the plug), or forks off a
     * separate upstream and then connects to that. It will return a
     * code telling us which kind of socket it put in 'sock'.
     */
    sock = NULL;
    logtext = ds_err = us_err = NULL;
    result = platform_ssh_share(
        sockname, conf, sshplug, &sharestate->plug, &sock, &logtext,
        &ds_err, &us_err, can_upstream, can_downstream);
    switch (result) {
      case SHARE_NONE:
        /*
         * We aren't sharing our connection at all (e.g. something
         * went wrong setting the socket up). Free the upstream
         * structure and return NULL.
         */

        if (logtext) {
            /* For this result, if 'logtext' is not NULL then it is an
             * error message indicating a reason why connection sharing
             * couldn't be set up _at all_ */
            logeventf(logctx,
                      "Could not set up connection sharing: %s", logtext);
        } else {
            /* Failing that, ds_err and us_err indicate why we
             * couldn't be a downstream and an upstream respectively */
            if (ds_err)
                logeventf(logctx, "Could not set up connection sharing"
                          " as downstream: %s", ds_err);
            if (us_err)
                logeventf(logctx, "Could not set up connection sharing"
                          " as upstream: %s", us_err);
        }

        assert(sock == NULL);
        *state = NULL;
        sfree(sharestate);
        sfree(sockname);
        break;

      case SHARE_DOWNSTREAM:
        /*
         * We are downstream, so free sharestate which it turns out we
         * don't need after all, and return the downstream socket as a
         * replacement for an ordinary SSH connection.
         */

        /* 'logtext' is a local endpoint address */
        logeventf(logctx, "Using existing shared connection at %s", logtext);

        *state = NULL;
        sfree(sharestate);
        sfree(sockname);
        toret = sock;
        break;

      case SHARE_UPSTREAM:
        /*
         * We are upstream. Set up sharestate properly and pass a copy
         * to the caller; return NULL, to tell ssh.c that it has to
         * make an ordinary connection after all.
         */

        /* 'logtext' is a local endpoint address */
        logeventf(logctx, "Sharing this connection at %s", logtext);

        *state = sharestate;
        sharestate->listensock = sock;
        sharestate->connections = newtree234(share_connstate_cmp);
        sharestate->server_verstring = NULL;
        sharestate->sockname = sockname;
        sharestate->nextid = 1;
        break;
    }

    sfree(logtext);
    sfree(ds_err);
    sfree(us_err);
    return toret;
}